

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZDisassembler.c
# Opt level: O2

DecodeStatus
decodeBDXAddr64Disp20Operand(MCInst *Inst,uint64_t Field,uint64_t Address,void *Decoder)

{
  DecodeStatus extraout_EAX;
  uint Reg;
  uint Reg_00;
  
  Reg = 0;
  Reg_00 = 0;
  if ((Field >> 0x14 & 0xf) != 0) {
    Reg_00 = SystemZMC_GR64Regs[(uint)(Field >> 0x14) & 0xf];
  }
  MCOperand_CreateReg0(Inst,Reg_00);
  MCOperand_CreateImm0
            (Inst,(long)((ulong)(((uint)Field & 0xff) << 0xc | (uint)(Field >> 8) & 0xfff) << 0x2c)
                  >> 0x2c);
  if (0xffffff < Field) {
    Reg = SystemZMC_GR64Regs[Field >> 0x18];
  }
  MCOperand_CreateReg0(Inst,Reg);
  return extraout_EAX;
}

Assistant:

static DecodeStatus decodeBDXAddr64Disp20Operand(MCInst *Inst, uint64_t Field,
		uint64_t Address, const void *Decoder)
{
	return decodeBDXAddr20Operand(Inst, Field, SystemZMC_GR64Regs);
}